

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cxx
# Opt level: O0

int __thiscall Function::copy(Function *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  offset_in_Function_to_subr oVar1;
  Function *f_local;
  Function *this_local;
  
  this->eType = *(FunctionType *)(dst + 0x9c);
  this->xLeft = *(Function **)(dst + 0xa8);
  if (this->xLeft != (Function *)0x0) {
    this->xLeft->functionUseCount = this->xLeft->functionUseCount + 1;
  }
  this->xRight = *(Function **)(dst + 0xb0);
  if (this->xRight != (Function *)0x0) {
    this->xRight->functionUseCount = this->xRight->functionUseCount + 1;
  }
  this->xPlus = *(Function **)(dst + 0xb8);
  if (this->xPlus != (Function *)0x0) {
    this->xPlus->functionUseCount = this->xPlus->functionUseCount + 1;
  }
  this->xTable = *(Matrix **)(dst + 0xc0);
  this->xSrc = *(double **)(dst + 0xa0);
  oVar1 = *(offset_in_Function_to_subr *)(dst + 200);
  *(undefined8 *)&this->field_0xd0 = *(undefined8 *)(dst + 0xd0);
  this->xFunction = oVar1;
  this->dValue = *(double *)(dst + 0xe8);
  this->dLastValue = *(double *)(dst + 0xf0);
  this->dXMin = *(double *)(dst + 0x120);
  this->dXMax = *(double *)(dst + 0x128);
  this->dXStep = *(double *)(dst + 0x130);
  this->dYMin = *(double *)(dst + 0x138);
  this->dYMax = *(double *)(dst + 0x140);
  this->dYStep = *(double *)(dst + 0x148);
  this->dXInput = *(double *)(dst + 0x100);
  this->dNextXInput = *(double *)(dst + 0x108);
  this->dYInput = *(double *)(dst + 0x110);
  this->dNextYInput = *(double *)(dst + 0x118);
  this->bValueValid = (bool)((byte)dst[0xf8] & 1);
  this->bVerbose = (bool)((byte)dst[0xd8] & 1);
  std::__cxx11::string::operator=((string *)&this->sName,(string *)(dst + 0x170));
  this->functionUseCount = *(int *)(dst + 0x98);
  return (int)this;
}

Assistant:

void Function::copy(const Function &f)
{
	eType = f.eType;
	xLeft = f.xLeft;
	if (xLeft)
		xLeft->functionUseCount++;
	xRight = f.xRight;
	if (xRight)
		xRight->functionUseCount++;
	xPlus = f.xPlus;
	if (xPlus)
		xPlus->functionUseCount++;
	xTable = f.xTable;
	xSrc = f.xSrc;
	xFunction = f.xFunction;
	dValue = f.dValue;
	dLastValue = f.dLastValue;
	dXMin = f.dXMin;
	dXMax = f.dXMax;
	dXStep = f.dXStep;
	dYMin = f.dYMin;
	dYMax = f.dYMax;
	dYStep = f.dYStep;
	dXInput = f.dXInput;
	dNextXInput = f.dNextXInput;
	dYInput = f.dYInput;
	dNextYInput = f.dNextYInput;
	bValueValid = f.bValueValid;
	bVerbose = f.bVerbose;
	sName = f.sName;
	functionUseCount = f.functionUseCount;
}